

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void setCursorMode(_GLFWwindow *window,int newMode)

{
  int local_20;
  int local_1c;
  int height;
  int width;
  int oldMode;
  int newMode_local;
  _GLFWwindow *window_local;
  
  height = window->cursorMode;
  width = newMode;
  _oldMode = window;
  if (((newMode == 0x34001) || (newMode == 0x34002)) || (newMode == 0x34003)) {
    if ((height != newMode) && (window->cursorMode = newMode, _glfw.cursorWindow == window)) {
      if (height == 0x34003) {
        _glfwPlatformSetCursorPos(window,_glfw.cursorPosX,_glfw.cursorPosY);
      }
      else if (newMode == 0x34003) {
        _glfwPlatformGetCursorPos(window,&_glfw.cursorPosX,&_glfw.cursorPosY);
        _oldMode->cursorPosX = _glfw.cursorPosX;
        _oldMode->cursorPosY = _glfw.cursorPosY;
        _glfwPlatformGetWindowSize(_oldMode,&local_1c,&local_20);
        _glfwPlatformSetCursorPos(_oldMode,(double)(local_1c / 2),(double)(local_20 / 2));
      }
      _glfwPlatformApplyCursorMode(_oldMode);
    }
  }
  else {
    _glfwInputError(0x10003,"Invalid cursor mode");
  }
  return;
}

Assistant:

static void setCursorMode(_GLFWwindow* window, int newMode)
{
    const int oldMode = window->cursorMode;

    if (newMode != GLFW_CURSOR_NORMAL &&
        newMode != GLFW_CURSOR_HIDDEN &&
        newMode != GLFW_CURSOR_DISABLED)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid cursor mode");
        return;
    }

    if (oldMode == newMode)
        return;

    window->cursorMode = newMode;

    if (_glfw.cursorWindow == window)
    {
        if (oldMode == GLFW_CURSOR_DISABLED)
        {
            _glfwPlatformSetCursorPos(window,
                                      _glfw.cursorPosX,
                                      _glfw.cursorPosY);
        }
        else if (newMode == GLFW_CURSOR_DISABLED)
        {
            int width, height;

            _glfwPlatformGetCursorPos(window,
                                      &_glfw.cursorPosX,
                                      &_glfw.cursorPosY);

            window->cursorPosX = _glfw.cursorPosX;
            window->cursorPosY = _glfw.cursorPosY;

            _glfwPlatformGetWindowSize(window, &width, &height);
            _glfwPlatformSetCursorPos(window, width / 2, height / 2);
        }

        _glfwPlatformApplyCursorMode(window);
    }
}